

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

bool __thiscall
t_cpp_generator::is_struct_storage_not_throwing(t_cpp_generator *this,t_struct *tstruct)

{
  bool bVar1;
  uint uVar2;
  t_base tVar3;
  members_type *__x;
  t_type *ptVar4;
  reference pptVar5;
  t_struct *this_00;
  reference pptVar6;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_80;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_78;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_68;
  const_iterator it;
  vector<t_field_*,_std::allocator<t_field_*>_> *more;
  t_type *type;
  size_t i;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  t_struct *tstruct_local;
  t_cpp_generator *this_local;
  
  members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)tstruct;
  __x = t_struct::get_members(tstruct);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&i,__x);
  type = (t_type *)0x0;
  do {
    ptVar4 = (t_type *)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)&i);
    if (ptVar4 <= type) {
      this_local._7_1_ = true;
LAB_00208a48:
      std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
                ((vector<t_field_*,_std::allocator<t_field_*>_> *)&i);
      return this_local._7_1_;
    }
    pptVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::operator[]
                        ((vector<t_field_*,_std::allocator<t_field_*>_> *)&i,(size_type)type);
    ptVar4 = t_field::get_type(*pptVar5);
    this_00 = (t_struct *)t_generator::get_true_type(ptVar4);
    uVar2 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xc])();
      if ((uVar2 & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_00208a48;
      }
      uVar2 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xb])();
        if ((uVar2 & 1) == 0) {
          this_local._7_1_ = false;
          goto LAB_00208a48;
        }
        it._M_current = (t_field **)t_struct::get_members(this_00);
        local_68._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)it._M_current);
        while( true ) {
          local_70._M_current =
               (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(it._M_current);
          bVar1 = __gnu_cxx::operator<(&local_68,&local_70);
          if (!bVar1) break;
          local_80._M_current =
               (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                         ((vector<t_field_*,_std::allocator<t_field_*>_> *)&i);
          local_88._M_current =
               (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                         ((vector<t_field_*,_std::allocator<t_field_*>_> *)&i);
          pptVar6 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_68);
          local_78 = std::
                     find<__gnu_cxx::__normal_iterator<t_field**,std::vector<t_field*,std::allocator<t_field*>>>,t_field*>
                               (local_80,local_88,pptVar6);
          local_90._M_current =
               (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                         ((vector<t_field_*,_std::allocator<t_field_*>_> *)&i);
          bVar1 = __gnu_cxx::operator==(&local_78,&local_90);
          if (bVar1) {
            pptVar6 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*(&local_68);
            std::vector<t_field_*,_std::allocator<t_field_*>_>::push_back
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)&i,pptVar6);
          }
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&local_68);
        }
      }
      else {
        tVar3 = t_base_type::get_base((t_base_type *)this_00);
        if ((tVar3 < TYPE_BOOL) || (5 < tVar3 - TYPE_BOOL)) {
          this_local._7_1_ = false;
          goto LAB_00208a48;
        }
      }
    }
    type = (t_type *)((long)&(type->super_t_doc)._vptr_t_doc + 1);
  } while( true );
}

Assistant:

bool t_cpp_generator::is_struct_storage_not_throwing(t_struct* tstruct) const {
  vector<t_field*> members = tstruct->get_members();

  for(size_t i=0; i < members.size(); ++i)  {
    t_type* type = get_true_type(members[i]->get_type());

    if(type->is_enum())
      continue;
    if(type->is_xception())
      return false;
    if(type->is_base_type()) switch(((t_base_type*)type)->get_base()) {
      case t_base_type::TYPE_BOOL:
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        continue;
      case t_base_type::TYPE_VOID:
      case t_base_type::TYPE_STRING:
      default:
        return false;
    }
    if(type->is_struct()) {
      const vector<t_field*>& more = ((t_struct*)type)->get_members();
      for(auto it = more.begin(); it < more.end(); ++it) {
        if(std::find(members.begin(), members.end(), *it) == members.end())
          members.push_back(*it);
      }
      continue;
    }
    return false; // rest-as-throwing(require-alloc)
  }
  return true;
}